

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsDataCollectionCreate(FmsMesh mesh,char *dc_name,FmsDataCollection *dc)

{
  int iVar1;
  FmsDataCollection str_copy_p;
  int iVar2;
  
  if (mesh == (FmsMesh)0x0) {
    iVar2 = 1;
  }
  else if (dc == (FmsDataCollection *)0x0) {
    iVar2 = 2;
  }
  else {
    str_copy_p = (FmsDataCollection)calloc(1,0x38);
    iVar2 = 3;
    if (str_copy_p != (FmsDataCollection)0x0) {
      iVar1 = FmsCopyString(dc_name,(char **)str_copy_p);
      if (iVar1 == 0) {
        str_copy_p->mesh = mesh;
        *dc = str_copy_p;
        iVar2 = 0;
      }
      else {
        free(str_copy_p);
      }
    }
  }
  return iVar2;
}

Assistant:

int FmsDataCollectionCreate(FmsMesh mesh, const char *dc_name,
                            FmsDataCollection *dc) {
  if (!mesh) { E_RETURN(1); }
  if (!dc) { E_RETURN(2); }
  FmsDataCollection dcoll;
  dcoll = calloc(1, sizeof(*dcoll));
  if (dcoll == NULL) { E_RETURN(3); }
  // On error, call free(dcoll)
  // Init dcoll
  if (FmsCopyString(dc_name, &dcoll->name)) { free(dcoll); E_RETURN(3); }
  dcoll->mesh = mesh;
  *dc = dcoll;
  return 0;
}